

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int create_course(course *course,course_strings *data)

{
  uchar *puVar1;
  uchar *puVar2;
  byte *pbVar3;
  byte bVar4;
  char cVar5;
  ushort *puVar6;
  int iVar7;
  subject_area sVar8;
  class_type cVar9;
  char *__ptr;
  ushort **ppuVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  int val;
  byte local_3a;
  char start_merid;
  char *local_38;
  
  course->course_name = data->course_name;
  course->co_requisites = data->co_requisites;
  course->instructor = data->instructor;
  course->pre_requisites = data->pre_requisites;
  course->course_id = data->course_id;
  iVar7 = parse_int(&val,data->units);
  if (iVar7 != 0) {
    return -1;
  }
  course->units = (uchar)val;
  iVar7 = parse_int(&val,data->max_enroll);
  if (iVar7 != 0) {
    return -1;
  }
  course->max_enrollment = (unsigned_short)val;
  pcVar15 = data->final_exam;
  puVar1 = &(course->final_exam_date).start_hour;
  puVar2 = &(course->final_exam_date).end_hour;
  iVar7 = __isoc99_sscanf(pcVar15," %2hhu/%2hhu/%4hu %2hhu:%2hhu%1c.M. - %2hhu:%2hhu:%2hhu%1c.M. ",
                          &course->final_exam_date,&(course->final_exam_date).day,
                          &(course->final_exam_date).year,puVar1,
                          &(course->final_exam_date).start_minute,&start_merid,puVar2,
                          &(course->final_exam_date).end_minute,&local_3a);
  if (iVar7 == -1) {
    return -1;
  }
  if ((start_merid & 0xdfU) == 0x50) {
    *puVar1 = *puVar1 + '\f';
  }
  if ((local_3a & 0xdf) == 0x50) {
    *puVar2 = *puVar2 + '\f';
  }
  pcVar14 = data->course_id;
  __ptr = (char *)malloc((size_t)pcVar15);
  if (__ptr == (char *)0x0) {
    return -1;
  }
  ppuVar10 = __ctype_b_loc();
  puVar6 = *ppuVar10;
  pcVar14 = pcVar14 + -1;
  do {
    bVar4 = pcVar14[1];
    uVar11 = (ulong)(char)bVar4;
    pcVar14 = pcVar14 + 1;
    pcVar12 = __ptr;
  } while ((*(byte *)((long)puVar6 + uVar11 * 2 + 1) & 0x20) != 0);
  while (bVar4 != 0) {
    if ((puVar6[(char)uVar11] & 8) == 0) goto LAB_00105147;
    *pcVar12 = (char)uVar11;
    bVar4 = pcVar14[1];
    uVar11 = (ulong)bVar4;
    pcVar14 = pcVar14 + 1;
    pcVar12 = pcVar12 + 1;
  }
  goto LAB_00105261;
LAB_00105147:
  do {
    cVar5 = *pcVar14;
    uVar11 = (ulong)cVar5;
    pcVar14 = pcVar14 + 1;
  } while ((*(byte *)((long)puVar6 + uVar11 * 2 + 1) & 0x20) != 0);
  local_38 = __ptr;
  if ((cVar5 != '\0') &&
     (pcVar12 = (char *)malloc((size_t)pcVar15), pcVar15 = local_38, __ptr = local_38,
     pcVar12 != (char *)0x0)) {
    lVar13 = 0;
    do {
      if ((puVar6[(char)uVar11] & 8) == 0) break;
      pcVar12[lVar13] = (char)uVar11;
      pbVar3 = (byte *)(pcVar14 + lVar13);
      uVar11 = (ulong)*pbVar3;
      lVar13 = lVar13 + 1;
    } while (*pbVar3 != 0);
    sVar8 = parse_subject_area(local_38);
    course->subject_area = sVar8;
    course->course_number = pcVar12;
    free(pcVar15);
    cVar9 = parse_class_type(data->class_type);
    course->class_type = cVar9;
    iVar7 = parse_days(course->days,data->days);
    if (iVar7 != 0) {
      return -1;
    }
    iVar7 = parse_times(course,data->times);
    if (iVar7 != 0) {
      return -1;
    }
    iVar7 = parse_int(&val,data->available_seats);
    if (iVar7 != 0) {
      return -1;
    }
    course->available_seats = (unsigned_short)val;
    iVar7 = parse_course_status(&course->status,data->course_status);
    if (iVar7 != 0) {
      return -1;
    }
    iVar7 = parse_int(&val,data->section_number);
    if (iVar7 != 0) {
      return -1;
    }
    course->section = (unsigned_short)val;
    iVar7 = parse_int(&val,data->call_number);
    if (iVar7 != 0) {
      return -1;
    }
    course->call_number = val;
    return 0;
  }
LAB_00105261:
  free(__ptr);
  return -1;
}

Assistant:

int create_course(struct course *course, const struct course_strings *data)
{
	int val, ret;

	course->course_name = data->course_name;
	course->co_requisites = data->co_requisites;
	course->instructor = data->instructor;
	course->pre_requisites = data->pre_requisites;
	course->course_id = data->course_id;

	ret = parse_int(&val, data->units);
	if (ret) return -1;
	course->units = val;

	ret = parse_int(&val, data->max_enroll);
	if (ret) return -1;
	course->max_enrollment = val;

	ret = parse_final_exam(course, data->final_exam);
	if (ret) return -1;

	ret = parse_course_id(&course->subject_area, &course->course_number, data->course_id);
	if (ret) return -1;

	course->class_type = parse_class_type(data->class_type);

	ret = parse_days(course->days, data->days);
	if (ret) return -1;

	ret = parse_times(course, data->times);
	if (ret) return -1;

	ret = parse_int(&val, data->available_seats);
	if (ret) return -1;
	course->available_seats = val;

	ret = parse_course_status(&course->status, data->course_status);
	if (ret) return -1;

	ret = parse_int(&val, data->section_number);
	if (ret) return -1;
	course->section = val;

	ret = parse_int(&val, data->call_number);
	if (ret) return -1;
	course->call_number = val;

	return 0;
}